

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O0

void __thiscall uint256_tests::comparison::test_method(comparison *this)

{
  bool bVar1;
  uchar *puVar2;
  uchar *puVar3;
  long in_FS_OFFSET;
  int i_1;
  int i;
  uint160 TmpS;
  uint160 LastS;
  uint256 TmpL;
  uint256 LastL;
  char *in_stack_fffffffffffff658;
  undefined1 *in_stack_fffffffffffff660;
  char *in_stack_fffffffffffff668;
  const_string *in_stack_fffffffffffff680;
  const_string *msg;
  size_t in_stack_fffffffffffff688;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffff690;
  char *file;
  unit_test_log_t *in_stack_fffffffffffff698;
  unit_test_log_t *this_00;
  int local_678;
  int local_65c;
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [16];
  const_string local_610;
  undefined1 local_600 [16];
  undefined1 local_5f0 [64];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [64];
  undefined1 local_560 [16];
  undefined1 local_550 [64];
  undefined1 local_510 [16];
  undefined1 local_500 [64];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [64];
  undefined1 local_470 [16];
  undefined1 local_460 [64];
  undefined1 local_420 [16];
  undefined1 local_410 [64];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [64];
  undefined1 local_380 [16];
  undefined1 local_370 [64];
  undefined1 local_330 [16];
  undefined1 local_320 [64];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [64];
  undefined1 local_290 [16];
  undefined1 local_280 [64];
  undefined1 local_240 [16];
  undefined1 local_230 [64];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [64];
  undefined1 local_1a0 [16];
  undefined1 local_190 [64];
  undefined1 local_150 [16];
  undefined1 local_140 [64];
  undefined1 local_100 [16];
  undefined1 local_f0 [64];
  lazy_ostream local_b0;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80;
  undefined1 local_7f;
  undefined1 local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  undefined1 local_78;
  undefined1 local_77;
  undefined1 local_76;
  undefined1 local_75;
  undefined1 local_74;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  lazy_ostream local_70;
  undefined1 local_5c [20];
  lazy_ostream local_48 [2];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uint256::uint256((uint256 *)in_stack_fffffffffffff658);
  for (local_65c = 0xff; -1 < local_65c; local_65c = local_65c + -1) {
    uint256::uint256((uint256 *)in_stack_fffffffffffff658);
    puVar2 = base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffff658);
    puVar2[local_65c >> 3] =
         puVar2[local_65c >> 3] | (byte)(1 << (7 - ((byte)local_65c & 7) & 0x1f));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
                 (unsigned_long)in_stack_fffffffffffff658);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
                 in_stack_fffffffffffff680);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
                 (unsigned_long)in_stack_fffffffffffff658);
      in_stack_fffffffffffff668 = "TmpL";
      in_stack_fffffffffffff660 = (undefined1 *)local_48;
      in_stack_fffffffffffff658 = "LastL";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
                (local_f0,local_100,0x72,1,4,local_28);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff658);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    in_stack_fffffffffffff668 = "R1L";
    in_stack_fffffffffffff660 = (undefined1 *)&R1L;
    in_stack_fffffffffffff658 = "ZeroL";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
              (local_140,local_150,0x76,1,4,ZeroL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    in_stack_fffffffffffff668 = "R1L";
    in_stack_fffffffffffff660 = (undefined1 *)&R1L;
    in_stack_fffffffffffff658 = "R2L";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
              (local_190,local_1a0,0x77,1,4,R2L);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    in_stack_fffffffffffff668 = "OneL";
    in_stack_fffffffffffff660 = OneL;
    in_stack_fffffffffffff658 = "ZeroL";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
              (local_1e0,local_1f0,0x78,1,4,ZeroL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    in_stack_fffffffffffff668 = "MaxL";
    in_stack_fffffffffffff660 = MaxL;
    in_stack_fffffffffffff658 = "OneL";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
              (local_230,local_240,0x79,1,4,OneL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    in_stack_fffffffffffff668 = "MaxL";
    in_stack_fffffffffffff660 = MaxL;
    in_stack_fffffffffffff658 = "R1L";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
              (local_280,local_290,0x7a,1,4,&R1L);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    in_stack_fffffffffffff668 = "MaxL";
    in_stack_fffffffffffff660 = MaxL;
    in_stack_fffffffffffff658 = "R2L";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
              (local_2d0,local_2e0,0x7b,1,4,R2L);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  uint160::uint160((uint160 *)in_stack_fffffffffffff658);
  for (local_678 = 0x9f; -1 < local_678; local_678 = local_678 + -1) {
    uint160::uint160((uint160 *)in_stack_fffffffffffff658);
    puVar2 = base_blob<160U>::begin((base_blob<160U> *)in_stack_fffffffffffff658);
    puVar2[local_678 >> 3] =
         puVar2[local_678 >> 3] | (byte)(1 << (7 - ((byte)local_678 & 7) & 0x1f));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
                 (unsigned_long)in_stack_fffffffffffff658);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
                 in_stack_fffffffffffff680);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
                 (unsigned_long)in_stack_fffffffffffff658);
      in_stack_fffffffffffff668 = "TmpS";
      in_stack_fffffffffffff660 = (undefined1 *)&local_70;
      in_stack_fffffffffffff658 = "LastS";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::lt_impl,uint160,uint160>
                (local_320,local_330,0x81,1,4,local_5c);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff658);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    in_stack_fffffffffffff668 = "R1S";
    in_stack_fffffffffffff660 = (undefined1 *)&R1S;
    in_stack_fffffffffffff658 = "ZeroS";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint160,uint160>
              (local_370,local_380,0x84,1,4,ZeroS);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    in_stack_fffffffffffff668 = "R1S";
    in_stack_fffffffffffff660 = (undefined1 *)&R1S;
    in_stack_fffffffffffff658 = "R2S";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint160,uint160>
              (local_3c0,local_3d0,0x85,1,4,R2S);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    in_stack_fffffffffffff668 = "OneS";
    in_stack_fffffffffffff660 = OneS;
    in_stack_fffffffffffff658 = "ZeroS";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint160,uint160>
              (local_410,local_420,0x86,1,4,ZeroS);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    in_stack_fffffffffffff668 = "MaxS";
    in_stack_fffffffffffff660 = MaxS;
    in_stack_fffffffffffff658 = "OneS";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint160,uint160>
              (local_460,local_470,0x87,1,4,OneS);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    in_stack_fffffffffffff668 = "MaxS";
    in_stack_fffffffffffff660 = MaxS;
    in_stack_fffffffffffff658 = "R1S";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint160,uint160>
              (local_4b0,local_4c0,0x88,1,4,&R1S);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    in_stack_fffffffffffff668 = "MaxS";
    in_stack_fffffffffffff660 = MaxS;
    in_stack_fffffffffffff658 = "R2S";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint160,uint160>
              (local_500,local_510,0x89,1,4,R2S);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    in_stack_fffffffffffff668 = "R1L";
    in_stack_fffffffffffff660 = (undefined1 *)&R1L;
    in_stack_fffffffffffff658 = "R2L";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
              (local_550,local_560,0x8c,1,4,R2L);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    puVar2 = base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffff658);
    in_stack_fffffffffffff660 = base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffff658)
    ;
    in_stack_fffffffffffff668 = "*R1L.begin()";
    in_stack_fffffffffffff658 = "*R2L.begin()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::lt_impl,unsigned_char,unsigned_char>
              (local_5a0,local_5b0,0x8e,1,4,puVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff688,
               in_stack_fffffffffffff680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    puVar2 = base_blob<256U>::end((base_blob<256U> *)in_stack_fffffffffffff658);
    puVar3 = base_blob<256U>::end((base_blob<256U> *)in_stack_fffffffffffff658);
    in_stack_fffffffffffff660 = puVar3 + -1;
    in_stack_fffffffffffff668 = "*(R2L.end()-1)";
    in_stack_fffffffffffff658 = "*(R1L.end()-1)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::lt_impl,unsigned_char,unsigned_char>
              (local_5f0,local_600,0x90,1,4,puVar2 + -1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    msg = &local_610;
    this_00 = (unit_test_log_t *)0x66;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    line_num = local_620;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff660,(char (*) [1])in_stack_fffffffffffff658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff668,in_stack_fffffffffffff660,
               (unsigned_long)in_stack_fffffffffffff658);
    local_71 = 0x10;
    local_72 = 0;
    local_73 = 0;
    local_74 = 0;
    local_75 = 0;
    local_76 = 0;
    local_77 = 0;
    local_78 = 0;
    local_79 = 0;
    local_7a = 0;
    local_7b = 0;
    local_7c = 0;
    local_7d = 0;
    local_7e = 0;
    local_7f = 0;
    local_80 = 0;
    local_81 = 0;
    local_82 = 0;
    local_83 = 0;
    local_84 = 0;
    local_85 = 0;
    local_86 = 0;
    local_87 = 0;
    local_88 = 0;
    local_89 = 0;
    local_8a = 0;
    local_8b = 0;
    local_8c = 0;
    local_8d = 0;
    local_8e = 0;
    local_8f = 0;
    local_90 = 0;
    local_91 = 0;
    local_92 = 0;
    local_93 = 0;
    local_94 = 0;
    local_95 = 0;
    local_96 = 0;
    local_97 = 0;
    local_98 = 0;
    local_99 = 0;
    local_9a = 0;
    local_9b = 0;
    local_9c = 0;
    local_9d = 0;
    local_9e = 0;
    local_9f = 0;
    local_a0 = 0;
    local_b0._15_1_ = 0;
    local_b0._14_1_ = 0;
    local_b0._13_1_ = 0;
    local_b0._12_1_ = 0;
    local_b0._11_1_ = 0;
    local_b0._10_1_ = 0;
    local_b0._9_1_ = 0;
    local_b0.m_empty = false;
    local_b0._vptr_lazy_ostream._7_1_ = 0;
    local_b0._vptr_lazy_ostream._6_1_ = 0;
    local_b0._vptr_lazy_ostream._5_1_ = 0;
    local_b0._vptr_lazy_ostream._4_1_ = 0;
    local_b0._vptr_lazy_ostream._3_1_ = 0;
    local_b0._vptr_lazy_ostream._2_1_ = 0;
    local_b0._vptr_lazy_ostream._1_1_ = 0;
    local_b0._vptr_lazy_ostream._0_1_ = 1;
    in_stack_fffffffffffff668 =
         "uint256{\"0000000000000000000000000000000000000000000000000000000000000001\"}";
    in_stack_fffffffffffff660 = (undefined1 *)&local_b0;
    in_stack_fffffffffffff658 =
         "uint256{\"1000000000000000000000000000000000000000000000000000000000000000\"}";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
              (local_640,local_650,0x93,1,4,&local_90);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( comparison ) // <= >= < >
{
    uint256 LastL;
    for (int i = 255; i >= 0; --i) {
        uint256 TmpL;
        *(TmpL.begin() + (i>>3)) |= 1<<(7-(i&7));
        BOOST_CHECK_LT(LastL, TmpL);
        LastL = TmpL;
    }

    BOOST_CHECK_LT(ZeroL, R1L);
    BOOST_CHECK_LT(R2L, R1L);
    BOOST_CHECK_LT(ZeroL, OneL);
    BOOST_CHECK_LT(OneL, MaxL);
    BOOST_CHECK_LT(R1L, MaxL);
    BOOST_CHECK_LT(R2L, MaxL);

    uint160 LastS;
    for (int i = 159; i >= 0; --i) {
        uint160 TmpS;
        *(TmpS.begin() + (i>>3)) |= 1<<(7-(i&7));
        BOOST_CHECK_LT(LastS, TmpS);
        LastS = TmpS;
    }
    BOOST_CHECK_LT(ZeroS, R1S);
    BOOST_CHECK_LT(R2S, R1S);
    BOOST_CHECK_LT(ZeroS, OneS);
    BOOST_CHECK_LT(OneS, MaxS);
    BOOST_CHECK_LT(R1S, MaxS);
    BOOST_CHECK_LT(R2S, MaxS);

    // Non-arithmetic uint256s compare from the beginning of their inner arrays:
    BOOST_CHECK_LT(R2L, R1L);
    // Ensure first element comparisons give the same order as above:
    BOOST_CHECK_LT(*R2L.begin(), *R1L.begin());
    // Ensure last element comparisons give a different result (swapped params):
    BOOST_CHECK_LT(*(R1L.end()-1), *(R2L.end()-1));
    // Hex strings represent reverse-encoded bytes, with lexicographic ordering:
    BOOST_CHECK_LT(uint256{"1000000000000000000000000000000000000000000000000000000000000000"},
                   uint256{"0000000000000000000000000000000000000000000000000000000000000001"});
}